

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateTune(zng_stream *strm,int32_t good_length,int32_t max_lazy,int32_t nice_length,
                       int32_t max_chain)

{
  internal_state *piVar1;
  int iVar2;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  zng_stream *in_RDI;
  uint in_R8D;
  deflate_state *s;
  int32_t local_4;
  
  iVar2 = deflateStateCheck(in_RDI);
  if (iVar2 == 0) {
    piVar1 = in_RDI->state;
    piVar1->good_match = in_ESI;
    piVar1->max_lazy_match = in_EDX;
    piVar1->nice_match = in_ECX;
    piVar1->max_chain_length = in_R8D;
    local_4 = 0;
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT PREFIX(deflateTune)(PREFIX3(stream) *strm, int32_t good_length, int32_t max_lazy, int32_t nice_length, int32_t max_chain) {
    deflate_state *s;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;
    s->good_match = (unsigned int)good_length;
    s->max_lazy_match = (unsigned int)max_lazy;
    s->nice_match = nice_length;
    s->max_chain_length = (unsigned int)max_chain;
    return Z_OK;
}